

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace.cpp
# Opt level: O1

void Al::internal::trace::write_trace_to_file(void)

{
  return;
}

Assistant:

void write_trace_to_file() {
#ifdef AL_TRACE
  char hostname[HOST_NAME_MAX];
  gethostname(hostname, HOST_NAME_MAX);
  pid_t pid = getpid();
  std::string filename = std::string(hostname) + "." + std::to_string(pid)
    + ".trace.txt";
  std::ofstream trace_file(filename);
  write_trace_log(trace_file);
#endif
}